

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttsbit.c
# Opt level: O0

FT_Error tt_face_load_sbit(TT_Face face,FT_Stream stream)

{
  FT_Memory pFVar1;
  undefined1 auVar2 [16];
  FT_Stream stream_00;
  FT_ULong FVar3;
  FT_StreamDesc local_70;
  FT_ULong ebdt_size;
  FT_ULong FStack_60;
  FT_UInt count_1;
  FT_ULong num_strikes_1;
  FT_UShort flags;
  FT_UShort version_1;
  FT_UInt count;
  FT_ULong num_strikes;
  FT_Fixed version;
  FT_Byte *p;
  FT_ULong table_start;
  FT_ULong table_size;
  FT_Stream pFStack_20;
  FT_Error error;
  FT_Stream stream_local;
  TT_Face face_local;
  
  face->sbit_table = (FT_Byte *)0x0;
  face->sbit_table_size = 0;
  face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
  face->sbit_num_strikes = 0;
  pFStack_20 = stream;
  stream_local = (FT_Stream)face;
  table_size._4_4_ = (*face->goto_table)(face,0x43424c43,stream,&table_start);
  if (table_size._4_4_ == 0) {
    *(undefined4 *)&stream_local[0xf].limit = 2;
    table_size._4_4_ = 0;
  }
  else {
    table_size._4_4_ =
         (*(code *)stream_local[10].pathname)(stream_local,0x45424c43,pFStack_20,&table_start);
    if (table_size._4_4_ != 0) {
      table_size._4_4_ =
           (*(code *)stream_local[10].pathname)(stream_local,0x626c6f63,pFStack_20,&table_start);
    }
    if (table_size._4_4_ == 0) {
      *(undefined4 *)&stream_local[0xf].limit = 1;
    }
  }
  if ((table_size._4_4_ != 0) &&
     (table_size._4_4_ =
           (*(code *)stream_local[10].pathname)(stream_local,0x73626978,pFStack_20,&table_start),
     table_size._4_4_ == 0)) {
    *(undefined4 *)&stream_local[0xf].limit = 3;
  }
  if (table_size._4_4_ == 0) {
    if (table_start < 8) {
      table_size._4_4_ = 3;
    }
    else {
      p = (FT_Byte *)FT_Stream_Pos(pFStack_20);
      if (*(int *)&stream_local[0xf].limit - 1U < 2) {
        table_size._4_4_ =
             FT_Stream_ExtractFrame(pFStack_20,table_start,(FT_Byte **)&stream_local[0xf].memory);
        if (table_size._4_4_ == 0) {
          stream_local[0xf].cursor = (uchar *)table_start;
          pFVar1 = stream_local[0xf].memory;
          num_strikes = (FT_ULong)
                        (int)((uint)*(byte *)&pFVar1->user << 0x18 |
                              (uint)*(byte *)((long)&pFVar1->user + 1) << 0x10 |
                              (uint)*(byte *)((long)&pFVar1->user + 2) << 8 |
                             (uint)*(byte *)((long)&pFVar1->user + 3));
          version = (FT_Fixed)&pFVar1->alloc;
          num_strikes_1._4_4_ =
               (uint)*(byte *)((long)&pFVar1->user + 4) << 0x18 |
               (uint)*(byte *)((long)&pFVar1->user + 5) << 0x10 |
               (uint)*(byte *)((long)&pFVar1->user + 6) << 8 |
               (uint)*(byte *)((long)&pFVar1->user + 7);
          _flags = (ulong)num_strikes_1._4_4_;
          if (((((num_strikes & 0xffff0000) == 0x20000) || ((num_strikes & 0xffff) == 0x200)) ||
              ((num_strikes & 0xffff0000) == 0x30000)) || ((num_strikes & 0xffff) == 0x300)) {
            if (_flags < 0x10000) {
              if (table_start < (ulong)num_strikes_1._4_4_ * 0x30 + 8) {
                auVar2._8_8_ = 0;
                auVar2._0_8_ = table_start - 8;
                num_strikes_1._4_4_ = SUB164(auVar2 / ZEXT816(0x30),0);
              }
              *(uint *)((long)&stream_local[0xf].limit + 4) = num_strikes_1._4_4_;
              table_size._4_4_ = 0;
              goto LAB_00190457;
            }
            table_size._4_4_ = 3;
          }
          else {
            table_size._4_4_ = 2;
          }
        }
      }
      else {
        if (*(int *)&stream_local[0xf].limit != 3) {
          table_size._4_4_ = 2;
LAB_00190457:
          stream_local[0x11].pos = 0;
          stream_local[0x11].descriptor.value = 0;
          if (*(int *)&stream_local[0xf].limit == 3) {
            stream_local[0x11].pos = (unsigned_long)p;
            stream_local[0x11].descriptor.value = table_start;
          }
          else if (*(int *)&stream_local[0xf].limit != 0) {
            table_size._4_4_ =
                 (*(code *)stream_local[10].pathname)(stream_local,0x43424454,pFStack_20,&local_70);
            if (table_size._4_4_ != 0) {
              table_size._4_4_ =
                   (*(code *)stream_local[10].pathname)
                             (stream_local,0x45424454,pFStack_20,&local_70);
            }
            if (table_size._4_4_ != 0) {
              table_size._4_4_ =
                   (*(code *)stream_local[10].pathname)
                             (stream_local,0x62646174,pFStack_20,&local_70);
            }
            if (table_size._4_4_ == 0) {
              FVar3 = FT_Stream_Pos(pFStack_20);
              stream_local[0x11].pos = FVar3;
              stream_local[0x11].descriptor = local_70;
            }
          }
          if (stream_local[0x11].descriptor.value == 0) {
            *(undefined4 *)((long)&stream_local[0xf].limit + 4) = 0;
          }
          return 0;
        }
        table_size._4_4_ = FT_Stream_EnterFrame(pFStack_20,8);
        if (table_size._4_4_ == 0) {
          num_strikes_1._2_2_ = FT_Stream_GetUShort(pFStack_20);
          num_strikes_1._0_2_ = FT_Stream_GetUShort(pFStack_20);
          FStack_60 = FT_Stream_GetULong(pFStack_20);
          FT_Stream_ExitFrame(pFStack_20);
          stream_00 = pFStack_20;
          if (num_strikes_1._2_2_ == 0) {
            table_size._4_4_ = 2;
          }
          else if ((((FT_UShort)num_strikes_1 == 1) || ((FT_UShort)num_strikes_1 == 3)) &&
                  (FStack_60 < 0x10000)) {
            ebdt_size._4_4_ = (int)FStack_60;
            if (table_start < (FStack_60 & 0xffffffff) * 4 + 8) {
              ebdt_size._4_4_ = (int)(table_start - 8 >> 2);
            }
            FVar3 = FT_Stream_Pos(pFStack_20);
            table_size._4_4_ = FT_Stream_Seek(stream_00,FVar3 - 8);
            if (table_size._4_4_ == 0) {
              stream_local[0xf].cursor = (uchar *)(ulong)(ebdt_size._4_4_ * 4 + 8);
              table_size._4_4_ =
                   FT_Stream_ExtractFrame
                             (pFStack_20,(FT_ULong)stream_local[0xf].cursor,
                              (FT_Byte **)&stream_local[0xf].memory);
              if (table_size._4_4_ == 0) {
                *(int *)((long)&stream_local[0xf].limit + 4) = ebdt_size._4_4_;
                table_size._4_4_ = 0;
                goto LAB_00190457;
              }
            }
          }
          else {
            table_size._4_4_ = 3;
          }
        }
      }
    }
  }
  if (table_size._4_4_ != 0) {
    if (stream_local[0xf].memory != (FT_Memory)0x0) {
      FT_Stream_ReleaseFrame(pFStack_20,(FT_Byte **)&stream_local[0xf].memory);
    }
    stream_local[0xf].cursor = (uchar *)0x0;
    *(undefined4 *)&stream_local[0xf].limit = 0;
  }
  return table_size._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_sbit( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;
    FT_ULong  table_size;
    FT_ULong  table_start;


    face->sbit_table       = NULL;
    face->sbit_table_size  = 0;
    face->sbit_table_type  = TT_SBIT_TABLE_TYPE_NONE;
    face->sbit_num_strikes = 0;

    error = face->goto_table( face, TTAG_CBLC, stream, &table_size );
    if ( !error )
      face->sbit_table_type = TT_SBIT_TABLE_TYPE_CBLC;
    else
    {
      error = face->goto_table( face, TTAG_EBLC, stream, &table_size );
      if ( error )
        error = face->goto_table( face, TTAG_bloc, stream, &table_size );
      if ( !error )
        face->sbit_table_type = TT_SBIT_TABLE_TYPE_EBLC;
    }

    if ( error )
    {
      error = face->goto_table( face, TTAG_sbix, stream, &table_size );
      if ( !error )
        face->sbit_table_type = TT_SBIT_TABLE_TYPE_SBIX;
    }
    if ( error )
      goto Exit;

    if ( table_size < 8 )
    {
      FT_ERROR(( "tt_face_load_sbit_strikes: table too short\n" ));
      error = FT_THROW( Invalid_File_Format );
      goto Exit;
    }

    table_start = FT_STREAM_POS();

    switch ( (FT_UInt)face->sbit_table_type )
    {
    case TT_SBIT_TABLE_TYPE_EBLC:
    case TT_SBIT_TABLE_TYPE_CBLC:
      {
        FT_Byte*  p;
        FT_Fixed  version;
        FT_ULong  num_strikes;
        FT_UInt   count;


        if ( FT_FRAME_EXTRACT( table_size, face->sbit_table ) )
          goto Exit;

        face->sbit_table_size = table_size;

        p = face->sbit_table;

        version     = FT_NEXT_LONG( p );
        num_strikes = FT_NEXT_ULONG( p );

        /* there's at least one font (FZShuSong-Z01, version 3)   */
        /* that uses the wrong byte order for the `version' field */
        if ( ( (FT_ULong)version & 0xFFFF0000UL ) != 0x00020000UL &&
             ( (FT_ULong)version & 0x0000FFFFUL ) != 0x00000200UL &&
             ( (FT_ULong)version & 0xFFFF0000UL ) != 0x00030000UL &&
             ( (FT_ULong)version & 0x0000FFFFUL ) != 0x00000300UL )
        {
          error = FT_THROW( Unknown_File_Format );
          goto Exit;
        }

        if ( num_strikes >= 0x10000UL )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /*
         *  Count the number of strikes available in the table.  We are a bit
         *  paranoid there and don't trust the data.
         */
        count = (FT_UInt)num_strikes;
        if ( 8 + 48UL * count > table_size )
          count = (FT_UInt)( ( table_size - 8 ) / 48 );

        face->sbit_num_strikes = count;
      }
      break;

    case TT_SBIT_TABLE_TYPE_SBIX:
      {
        FT_UShort  version;
        FT_UShort  flags;
        FT_ULong   num_strikes;
        FT_UInt    count;


        if ( FT_FRAME_ENTER( 8 ) )
          goto Exit;

        version     = FT_GET_USHORT();
        flags       = FT_GET_USHORT();
        num_strikes = FT_GET_ULONG();

        FT_FRAME_EXIT();

        if ( version < 1 )
        {
          error = FT_THROW( Unknown_File_Format );
          goto Exit;
        }

        /* Bit 0 must always be `1'.                            */
        /* Bit 1 controls the overlay of bitmaps with outlines. */
        /* All other bits should be zero.                       */
        if ( !( flags == 1 || flags == 3 ) ||
             num_strikes >= 0x10000UL      )
        {
          error = FT_THROW( Invalid_File_Format );
          goto Exit;
        }

        /* we currently don't support bit 1; however, it is better to */
        /* draw at least something...                                 */
        if ( flags == 3 )
          FT_TRACE1(( "tt_face_load_sbit_strikes:"
                      " sbix overlay not supported yet\n"
                      "                          "
                      " expect bad rendering results\n" ));

        /*
         *  Count the number of strikes available in the table.  We are a bit
         *  paranoid there and don't trust the data.
         */
        count = (FT_UInt)num_strikes;
        if ( 8 + 4UL * count > table_size )
          count = (FT_UInt)( ( table_size - 8 ) / 4 );

        if ( FT_STREAM_SEEK( FT_STREAM_POS() - 8 ) )
          goto Exit;

        face->sbit_table_size = 8 + count * 4;
        if ( FT_FRAME_EXTRACT( face->sbit_table_size, face->sbit_table ) )
          goto Exit;

        face->sbit_num_strikes = count;
      }
      break;

    default:
      /* we ignore unknown table formats */
      error = FT_THROW( Unknown_File_Format );
      break;
    }

    if ( !error )
      FT_TRACE3(( "tt_face_load_sbit_strikes: found %u strikes\n",
                  face->sbit_num_strikes ));

    face->ebdt_start = 0;
    face->ebdt_size  = 0;

    if ( face->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX )
    {
      /* the `sbix' table is self-contained; */
      /* it has no associated data table     */
      face->ebdt_start = table_start;
      face->ebdt_size  = table_size;
    }
    else if ( face->sbit_table_type != TT_SBIT_TABLE_TYPE_NONE )
    {
      FT_ULong  ebdt_size;


      error = face->goto_table( face, TTAG_CBDT, stream, &ebdt_size );
      if ( error )
        error = face->goto_table( face, TTAG_EBDT, stream, &ebdt_size );
      if ( error )
        error = face->goto_table( face, TTAG_bdat, stream, &ebdt_size );

      if ( !error )
      {
        face->ebdt_start = FT_STREAM_POS();
        face->ebdt_size  = ebdt_size;
      }
    }

    if ( !face->ebdt_size )
    {
      FT_TRACE2(( "tt_face_load_sbit_strikes:"
                  " no embedded bitmap data table found;\n"
                  "                          "
                  " resetting number of strikes to zero\n" ));
      face->sbit_num_strikes = 0;
    }

    return FT_Err_Ok;

  Exit:
    if ( error )
    {
      if ( face->sbit_table )
        FT_FRAME_RELEASE( face->sbit_table );
      face->sbit_table_size = 0;
      face->sbit_table_type = TT_SBIT_TABLE_TYPE_NONE;
    }

    return error;
  }